

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

_Bool duckdb_je_pac_retain_grow_limit_get_set
                (tsdn_t *tsdn,pac_t *pac,size_t *old_limit,size_t *new_limit)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  
  if (new_limit == (size_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar1 = *new_limit;
    if (uVar1 + 1 < 0x7000000000000001) {
      if (uVar1 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar5 = (uint)lVar2 ^ 0x3f;
      }
      iVar3 = 0x32 - uVar5;
      if (0x32 < uVar5) {
        iVar3 = 0;
      }
      bVar4 = 0xc;
      if (0x3fff < uVar1) {
        bVar4 = (char)iVar3 + 0xb;
      }
      uVar5 = (((uint)(uVar1 >> (bVar4 & 0x3f)) & 3) + iVar3 * 4) - 1;
      if (0xc6 < uVar5) {
        return true;
      }
    }
    else {
      uVar5 = 0xc6;
    }
  }
  malloc_mutex_lock(tsdn,&pac->grow_mtx);
  if (old_limit != (size_t *)0x0) {
    *old_limit = duckdb_je_sz_pind2sz_tab[(pac->exp_grow).limit];
  }
  if (new_limit != (size_t *)0x0) {
    (pac->exp_grow).limit = uVar5;
  }
  (pac->grow_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48));
  return false;
}

Assistant:

bool
pac_retain_grow_limit_get_set(tsdn_t *tsdn, pac_t *pac, size_t *old_limit,
    size_t *new_limit) {
	pszind_t new_ind JEMALLOC_CC_SILENCE_INIT(0);
	if (new_limit != NULL) {
		size_t limit = *new_limit;
		/* Grow no more than the new limit. */
		if ((new_ind = sz_psz2ind(limit + 1) - 1) >= SC_NPSIZES) {
			return true;
		}
	}

	malloc_mutex_lock(tsdn, &pac->grow_mtx);
	if (old_limit != NULL) {
		*old_limit = sz_pind2sz(pac->exp_grow.limit);
	}
	if (new_limit != NULL) {
		pac->exp_grow.limit = new_ind;
	}
	malloc_mutex_unlock(tsdn, &pac->grow_mtx);

	return false;
}